

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# httpserver.cpp
# Opt level: O2

void __thiscall
HTTPRequestTracker::RemoveConnection(HTTPRequestTracker *this,evhttp_connection *conn)

{
  evhttp_connection **__k;
  iterator it;
  long in_FS_OFFSET;
  UniqueLock<AnnotatedMixin<std::mutex>_> criticalblock11;
  evhttp_connection *local_38;
  unique_lock<std::mutex> local_30;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  local_38 = conn;
  UniqueLock<AnnotatedMixin<std::mutex>_>::UniqueLock
            ((UniqueLock<AnnotatedMixin<std::mutex>_> *)&local_30,&this->m_mutex,"m_mutex",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/httpserver.cpp"
             ,0xc1,false);
  __k = inline_assertion_check<true,evhttp_connection_const*&>
                  (&local_38,
                   "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/httpserver.cpp"
                   ,0xc2,"RemoveConnection","conn");
  it = std::
       _Hashtable<const_evhttp_connection_*,_std::pair<const_evhttp_connection_*const,_unsigned_long>,_std::allocator<std::pair<const_evhttp_connection_*const,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<const_evhttp_connection_*>,_std::hash<const_evhttp_connection_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
       ::find(&(this->m_tracker)._M_h,__k);
  if (it.super__Node_iterator_base<std::pair<const_evhttp_connection_*const,_unsigned_long>,_false>.
      _M_cur != (__node_type *)0x0) {
    RemoveConnectionInternal
              (this,(iterator)
                    it.
                    super__Node_iterator_base<std::pair<const_evhttp_connection_*const,_unsigned_long>,_false>
                    ._M_cur);
  }
  std::unique_lock<std::mutex>::~unique_lock(&local_30);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

EXCLUSIVE_LOCKS_REQUIRED(!m_mutex)
    {
        LOCK(m_mutex);
        auto it{m_tracker.find(Assert(conn))};
        if (it != m_tracker.end()) RemoveConnectionInternal(it);
    }